

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::RgbaInputFile::FromYca::readPixels(FromYca *this,int scanLine1,int scanLine2)

{
  bool bVar1;
  int scanLine;
  
  scanLine = scanLine2;
  if (scanLine2 < scanLine1) {
    scanLine = scanLine1;
    scanLine1 = scanLine2;
  }
  if (this->_lineOrder == INCREASING_Y) {
    do {
      readPixels(this,scanLine1);
      scanLine1 = scanLine1 + 1;
    } while (scanLine + 1 != scanLine1);
  }
  else {
    do {
      readPixels(this,scanLine);
      bVar1 = scanLine1 < scanLine;
      scanLine = scanLine + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void
RgbaInputFile::FromYca::readPixels (int scanLine1, int scanLine2)
{
    int minY = min (scanLine1, scanLine2);
    int maxY = max (scanLine1, scanLine2);

    if (_lineOrder == INCREASING_Y)
    {
        for (int y = minY; y <= maxY; ++y)
            readPixels (y);
    }
    else
    {
        for (int y = maxY; y >= minY; --y)
            readPixels (y);
    }
}